

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_setup_encoder(opj_cinfo_t *cinfo,opj_cparameters_t *parameters,opj_image_t *image)

{
  opj_image_t *image_00;
  opj_cparameters_t *in_RDX;
  opj_jp2_t *in_RSI;
  long in_RDI;
  opj_cparameters_t *in_stack_00000028;
  opj_j2k_t *in_stack_00000030;
  
  if (((in_RDI != 0) && (in_RSI != (opj_jp2_t *)0x0)) && (in_RDX != (opj_cparameters_t *)0x0)) {
    image_00 = (opj_image_t *)(ulong)(*(int *)(in_RDI + 0x14) + 1);
    switch(image_00) {
    case (opj_image_t *)0x0:
    case (opj_image_t *)0x2:
      break;
    case (opj_image_t *)0x1:
      j2k_setup_encoder(in_stack_00000030,in_stack_00000028,(opj_image_t *)cinfo);
      break;
    case (opj_image_t *)0x3:
      jp2_setup_encoder(in_RSI,in_RDX,image_00);
    }
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_setup_encoder(opj_cinfo_t *cinfo, opj_cparameters_t *parameters, opj_image_t *image) {
	if(cinfo && parameters && image) {
		switch(cinfo->codec_format) {
			case CODEC_J2K:
				j2k_setup_encoder((opj_j2k_t*)cinfo->j2k_handle, parameters, image);
				break;
			case CODEC_JP2:
				jp2_setup_encoder((opj_jp2_t*)cinfo->jp2_handle, parameters, image);
				break;
			case CODEC_JPT:
			case CODEC_UNKNOWN:
			default:
				break;
		}
	}
}